

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::read_pvd
               (istream *stream,vector<double,_std::allocator<double>_> *times_out,
               vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
               *pvtupaths_out)

{
  bool bVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  allocator local_149;
  string local_148 [32];
  path local_128;
  allocator local_101;
  string local_100 [32];
  double local_e0;
  undefined1 local_d8 [8];
  Tag tag;
  string local_70 [8];
  string line;
  undefined1 local_50 [8];
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> pvtupaths;
  vector<double,_std::allocator<double>_> times;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *pvtupaths_out_local
  ;
  vector<double,_std::allocator<double>_> *times_out_local;
  istream *stream_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &pvtupaths.
              super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::vector
            ((vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *)
             local_50);
  std::__cxx11::string::string(local_70);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,local_70);
    bVar1 = std::ios::operator_cast_to_bool(piVar2 + *(long *)(*(long *)piVar2 + -0x18));
    if (!bVar1) break;
    xml_lite::Tag::Tag((Tag *)local_d8);
    bVar1 = xml_lite::parse_tag((string *)local_70,(Tag *)local_d8);
    if (bVar1) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"DataSet");
      if (bVar1) {
        tag.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,"timestep",&local_101);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&tag.type,(key_type *)local_100);
        local_e0 = std::__cxx11::stod(pmVar3,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &pvtupaths.
                    super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_e0);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,"file",&local_149);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&tag.type,(key_type *)local_148);
        filesystem::path::path(&local_128,pmVar3);
        std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::
        push_back((vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *)
                  local_50,&local_128);
        filesystem::path::~path(&local_128);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        tag.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
      }
    }
    else {
      tag.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
    }
    xml_lite::Tag::~Tag((Tag *)local_d8);
  }
  tag.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 2;
  std::__cxx11::string::~string(local_70);
  std::vector<double,_std::allocator<double>_>::operator=
            (times_out,
             (vector<double,_std::allocator<double>_> *)
             &pvtupaths.
              super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::operator=
            (pvtupaths_out,
             (vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *)
             local_50);
  std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::~vector
            ((vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *)
             local_50);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &pvtupaths.
              super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void read_pvd(std::istream& stream, std::vector<Real>* times_out,
    std::vector<filesystem::path>* pvtupaths_out) {
  std::vector<Real> times;
  std::vector<filesystem::path> pvtupaths;
  for (std::string line; std::getline(stream, line);) {
    xml_lite::Tag tag;
    if (!xml_lite::parse_tag(line, &tag)) continue;
    if (tag.elem_name != "DataSet") continue;
    times.push_back(std::stod(tag.attribs["timestep"]));
    pvtupaths.push_back(tag.attribs["file"]);
  }
  *times_out = times;
  *pvtupaths_out = pvtupaths;
}